

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestNode *pTVar2;
  undefined4 uVar3;
  int extraout_EAX;
  ShaderReturnCase *pSVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  undefined8 uVar6;
  size_type *psVar7;
  long *plVar8;
  ulong uVar9;
  char *pcVar10;
  ReturnMode RVar11;
  bool bVar12;
  bool bVar13;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  string description;
  string name;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  TestNode *local_78;
  ulong local_70;
  char *local_68;
  char *local_60;
  uint local_54;
  long *local_50 [2];
  long local_40 [2];
  
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(this->super_TestCaseGroup).m_context,"single_return_vertex",
             "Single return statement in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  RVar11 = RETURNMODE_ALWAYS;
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(this->super_TestCaseGroup).m_context,"single_return_fragment",
             "Single return statement in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  local_78 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pTVar2 = local_78;
  paVar1 = &description.field_2;
  do {
    bVar13 = true;
    do {
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"conditional_return_","");
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        description.field_2._M_allocated_capacity = *psVar7;
        description.field_2._8_8_ = plVar5[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar7;
        description._M_dataplus._M_p = (pointer)*plVar5;
      }
      description._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&description);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        name.field_2._M_allocated_capacity = *psVar7;
        name.field_2._8_8_ = plVar5[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar7;
        name._M_dataplus._M_p = (pointer)*plVar5;
      }
      name._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (RVar11 < RETURNMODE_LAST) {
        pcVar10 = (&PTR_anon_var_dwarf_1c8e677_0212b078)[RVar11];
      }
      else {
        pcVar10 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,pcVar10,(allocator<char> *)&local_98);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        description.field_2._M_allocated_capacity = *psVar7;
        description.field_2._8_8_ = plVar5[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar7;
        description._M_dataplus._M_p = (pointer)*plVar5;
      }
      description._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      pSVar4 = makeConditionalReturnInFuncCase
                         ((Context *)pTVar2[1]._vptr_TestNode,name._M_dataplus._M_p,
                          description._M_dataplus._M_p,RVar11,bVar13);
      tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      bVar12 = bVar13 != false;
      bVar13 = false;
    } while (bVar12);
    RVar11 = RVar11 + RETURNMODE_NEVER;
  } while (RVar11 != RETURNMODE_LAST);
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  pTVar2 = local_78;
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(Context *)local_78[1]._vptr_TestNode,"double_return_vertex",
             "Unconditional double return in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(Context *)pTVar2[1]._vptr_TestNode,"double_return_fragment",
             "Unconditional double return in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(Context *)pTVar2[1]._vptr_TestNode,"last_statement_in_main_vertex",
             "Return as a final statement in main()",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(Context *)pTVar2[1]._vptr_TestNode,"last_statement_in_main_fragment",
             "Return as a final statement in main()",false,
             "varying mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_FragColor = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
  pTVar2 = local_78;
  uVar6 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  uVar9 = 0;
  do {
    local_54 = (uint)uVar6;
    bVar13 = (uVar9 & 1) != 0;
    local_60 = "";
    if (bVar13) {
      local_60 = "in_func_";
    }
    local_68 = " in main()";
    if (bVar13) {
      local_68 = " in user-defined function";
    }
    RVar11 = RETURNMODE_ALWAYS;
    local_70 = uVar9;
    do {
      bVar13 = true;
      do {
        local_98 = &local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"output_write_","");
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_f8 = &local_e8;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_e8 = *plVar8;
          lStack_e0 = plVar5[3];
        }
        else {
          local_e8 = *plVar8;
          local_f8 = (long *)*plVar5;
        }
        local_f0 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          description.field_2._M_allocated_capacity = *psVar7;
          description.field_2._8_8_ = plVar5[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar7;
          description._M_dataplus._M_p = (pointer)*plVar5;
        }
        description._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&description);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          name.field_2._M_allocated_capacity = *psVar7;
          name.field_2._8_8_ = plVar5[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar7;
          name._M_dataplus._M_p = (pointer)*plVar5;
        }
        name._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (RVar11 < RETURNMODE_LAST) {
          pcVar10 = (&PTR_anon_var_dwarf_1c8e677_0212b078)[RVar11];
        }
        else {
          pcVar10 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,pcVar10,(allocator<char> *)local_50);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_f8 = &local_e8;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_e8 = *plVar8;
          lStack_e0 = plVar5[3];
        }
        else {
          local_e8 = *plVar8;
          local_f8 = (long *)*plVar5;
        }
        local_f0 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          description.field_2._M_allocated_capacity = *psVar7;
          description.field_2._8_8_ = plVar5[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar7;
          description._M_dataplus._M_p = (pointer)*plVar5;
        }
        description._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        uVar6 = 0;
        pSVar4 = makeOutputWriteReturnCase
                           ((Context *)pTVar2[1]._vptr_TestNode,name._M_dataplus._M_p,
                            description._M_dataplus._M_p,(bool)((byte)local_70 & 1),RVar11,bVar13);
        tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        bVar12 = bVar13 != false;
        bVar13 = false;
      } while (bVar12);
      RVar11 = RVar11 + RETURNMODE_NEVER;
    } while (RVar11 != RETURNMODE_LAST);
    uVar9 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
    uVar6 = 0;
  } while ((local_54 & 1) != 0);
  uVar3 = 1;
  uVar6 = 0;
  do {
    local_70 = CONCAT44(local_70._4_4_,uVar3);
    local_60 = "static";
    if ((char)uVar6 != '\0') {
      local_60 = "dynamic";
    }
    RVar11 = RETURNMODE_ALWAYS;
    local_68 = (char *)uVar6;
    do {
      bVar13 = true;
      do {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"return_in_","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
        local_98 = &local_88;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_88 = *plVar8;
          lStack_80 = plVar5[3];
        }
        else {
          local_88 = *plVar8;
          local_98 = (long *)*plVar5;
        }
        local_90 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_f8 = &local_e8;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_e8 = *plVar8;
          lStack_e0 = plVar5[3];
        }
        else {
          local_e8 = *plVar8;
          local_f8 = (long *)*plVar5;
        }
        local_f0 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          description.field_2._M_allocated_capacity = *psVar7;
          description.field_2._8_8_ = plVar5[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar7;
          description._M_dataplus._M_p = (pointer)*plVar5;
        }
        description._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&description);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          name.field_2._M_allocated_capacity = *psVar7;
          name.field_2._8_8_ = plVar5[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar7;
          name._M_dataplus._M_p = (pointer)*plVar5;
        }
        name._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (RVar11 < RETURNMODE_LAST) {
          pcVar10 = (&PTR_anon_var_dwarf_1c8e677_0212b078)[RVar11];
        }
        else {
          pcVar10 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,pcVar10,(allocator<char> *)&local_98);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f8);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          description.field_2._M_allocated_capacity = *psVar7;
          description.field_2._8_8_ = plVar5[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar7;
          description._M_dataplus._M_p = (pointer)*plVar5;
        }
        description._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        pTVar2 = local_78;
        uVar6 = 0;
        pSVar4 = makeReturnInLoopCase
                           ((Context *)local_78[1]._vptr_TestNode,name._M_dataplus._M_p,
                            description._M_dataplus._M_p,(bool)((byte)local_68 & 1),RVar11,bVar13);
        tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        bVar12 = bVar13 != false;
        bVar13 = false;
      } while (bVar12);
      RVar11 = RVar11 + RETURNMODE_NEVER;
    } while (RVar11 != RETURNMODE_LAST);
    uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
    uVar3 = 0;
  } while ((local_70 & 1) != 0);
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  pTVar2 = local_78;
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(Context *)local_78[1]._vptr_TestNode,"return_in_infinite_loop_vertex",
             "Return in infinite loop",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\nuniform int ui_zero;\n\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
  pSVar4 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar4,(Context *)pTVar2[1]._vptr_TestNode,"return_in_infinite_loop_fragment",
             "Return in infinite loop",false,
             "varying mediump vec4 v_coords;\nuniform int ui_zero;\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_FragColor = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar4);
  return extraout_EAX;
}

Assistant:

void ShaderReturnTests::init (void)
{
	// Single return statement in function.
	addChild(new ShaderReturnCase(m_context, "single_return_vertex", "Single return statement in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "single_return_fragment", "Single return statement in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			string name			= string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			addChild(makeConditionalReturnInFuncCase(m_context, name.c_str(), description.c_str(), (ReturnMode)returnMode, isFragment == 0));
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_context, "double_return_vertex", "Unconditional double return in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "double_return_fragment", "Unconditional double return in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"varying mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name = string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string desc = string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";

				addChild(makeOutputWriteReturnCase(m_context, name.c_str(), desc.c_str(), inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name			= string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				addChild(makeReturnInLoopCase(m_context, name.c_str(), description.c_str(), isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n"
		"uniform int ui_zero;\n\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"varying mediump vec4 v_coords;\n"
		"uniform int ui_zero;\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
}